

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  sqlite3_uint64 n;
  int iVar1;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  int iVar4;
  void *__s;
  long lVar5;
  ulong uVar6;
  Fts3Expr *pFVar7;
  Fts3Expr **ppFVar8;
  ulong uVar9;
  Fts3Expr *pFVar10;
  Fts3Expr *pFVar11;
  long in_FS_OFFSET;
  Fts3Expr *local_60;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = *pp;
  if (nMaxDepth == 0) {
    iVar4 = 1;
  }
  else {
    iVar1 = local_60->eType;
    if (1 < iVar1 - 3U) {
      if (iVar1 == 2) {
        pLeft = local_60->pLeft;
        pFVar10 = local_60->pRight;
        local_60->pLeft = (Fts3Expr *)0x0;
        local_60->pRight = (Fts3Expr *)0x0;
        pLeft->pParent = (Fts3Expr *)0x0;
        pFVar10->pParent = (Fts3Expr *)0x0;
        pRight = pFVar10;
        iVar4 = fts3ExprBalance(&pLeft,nMaxDepth + -1);
        if ((iVar4 == 0) &&
           (iVar4 = fts3ExprBalance(&pRight,nMaxDepth + -1), pFVar10 = pRight, iVar4 == 0)) {
          local_60->pLeft = pLeft;
          pLeft->pParent = local_60;
          local_60->pRight = pRight;
          pRight->pParent = local_60;
          iVar4 = 0;
        }
        else {
          sqlite3Fts3ExprFree(pFVar10);
          sqlite3Fts3ExprFree(pLeft);
        }
        goto LAB_001b0cf9;
      }
      goto LAB_001b0d0a;
    }
    n = (long)nMaxDepth * 8;
    __s = sqlite3_malloc64(n);
    if (__s != (void *)0x0) {
      memset(__s,0,n);
      for (pLeft = local_60; pLeft->eType == iVar1; pLeft = pLeft->pLeft) {
      }
      pFVar10 = (Fts3Expr *)0x0;
      do {
        pFVar2 = pLeft->pParent;
        pLeft->pParent = (Fts3Expr *)0x0;
        if (pFVar2 == (Fts3Expr *)0x0) {
          local_60 = (Fts3Expr *)0x0;
        }
        else {
          pFVar2->pLeft = (Fts3Expr *)0x0;
        }
        iVar4 = fts3ExprBalance(&pLeft,nMaxDepth + -1);
        if (iVar4 != 0) {
LAB_001b0c61:
          uVar6 = 0;
          uVar9 = (ulong)(uint)nMaxDepth;
          if (nMaxDepth < 1) {
            uVar9 = 0;
          }
          for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
            sqlite3Fts3ExprFree(*(Fts3Expr **)((long)__s + uVar6 * 8));
          }
          while (pFVar10 != (Fts3Expr *)0x0) {
            pFVar2 = pFVar10->pParent;
            sqlite3_free(pFVar10);
            pFVar10 = pFVar2;
          }
          goto LAB_001b0cf1;
        }
        pFVar11 = pLeft;
        for (lVar5 = 0; (pFVar11 != (Fts3Expr *)0x0 && (lVar5 < nMaxDepth)); lVar5 = lVar5 + 1) {
          pFVar7 = *(Fts3Expr **)((long)__s + lVar5 * 8);
          if (pFVar7 == (Fts3Expr *)0x0) {
            pFVar7 = (Fts3Expr *)0x0;
          }
          else {
            pFVar10->pLeft = pFVar7;
            pFVar10->pRight = pFVar11;
            pFVar7->pParent = pFVar10;
            pFVar11->pParent = pFVar10;
            pFVar3 = pFVar10->pParent;
            pFVar10->pParent = (Fts3Expr *)0x0;
            pFVar11 = (Fts3Expr *)0x0;
            pFVar7 = pFVar10;
            pFVar10 = pFVar3;
          }
          *(Fts3Expr **)((long)__s + lVar5 * 8) = pFVar11;
          pFVar11 = pFVar7;
        }
        if (pFVar11 != (Fts3Expr *)0x0) {
          sqlite3Fts3ExprFree(pFVar11);
          iVar4 = 0x12;
          goto LAB_001b0c61;
        }
        if (pFVar2 == (Fts3Expr *)0x0) goto LAB_001b0ca1;
        ppFVar8 = &pFVar2->pRight;
        do {
          pLeft = *ppFVar8;
          ppFVar8 = &pLeft->pLeft;
        } while (pLeft->eType == iVar1);
        pFVar11 = pFVar2->pParent;
        pFVar7 = pFVar2->pRight;
        pFVar7->pParent = pFVar11;
        if (pFVar11 != (Fts3Expr *)0x0) {
          pFVar11->pLeft = pFVar7;
          pFVar7 = local_60;
        }
        local_60 = pFVar7;
        pFVar2->pParent = pFVar10;
        pFVar10 = pFVar2;
      } while( true );
    }
    iVar4 = 7;
  }
  goto LAB_001b0cfd;
LAB_001b0ca1:
  iVar4 = 0;
  uVar9 = (ulong)(uint)nMaxDepth;
  if (nMaxDepth < 1) {
    uVar9 = 0;
  }
  local_60 = (Fts3Expr *)0x0;
  for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    pFVar2 = *(Fts3Expr **)((long)__s + uVar6 * 8);
    pFVar11 = pFVar10;
    pFVar7 = local_60;
    if (pFVar2 != (Fts3Expr *)0x0) {
      pFVar7 = pFVar2;
      if (local_60 != (Fts3Expr *)0x0) {
        pFVar10->pRight = local_60;
        pFVar2 = *(Fts3Expr **)((long)__s + uVar6 * 8);
        pFVar10->pLeft = pFVar2;
        pFVar2->pParent = pFVar10;
        local_60->pParent = pFVar10;
        pFVar11 = pFVar10->pParent;
        pFVar7 = pFVar10;
      }
      pFVar7->pParent = (Fts3Expr *)0x0;
    }
    pFVar10 = pFVar11;
    local_60 = pFVar7;
  }
LAB_001b0cf1:
  sqlite3_free(__s);
LAB_001b0cf9:
  if (iVar4 == 0) {
LAB_001b0d0a:
    iVar4 = 0;
    goto LAB_001b0d0c;
  }
LAB_001b0cfd:
  sqlite3Fts3ExprFree(local_60);
  local_60 = (Fts3Expr *)0x0;
LAB_001b0d0c:
  *pp = local_60;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}